

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlAttrPtr xmlGetPropNodeInternal(xmlNode *node,xmlChar *name,xmlChar *nsName,int useDTD)

{
  _xmlDoc *p_Var1;
  bool bVar2;
  int iVar3;
  xmlChar *cur;
  xmlDoc *doc;
  xmlNsPtr *elem;
  xmlNsPtr *ppxVar4;
  xmlNsPtr pxVar5;
  xmlAttributePtr pxVar6;
  xmlNsPtr *ppxVar7;
  xmlNsPtr *ppxVar8;
  xmlAttrPtr pxVar9;
  xmlNsPtr *local_40;
  
  if (node == (xmlNode *)0x0) {
    return (xmlAttrPtr)0x0;
  }
  if (name == (xmlChar *)0x0) {
    return (xmlAttrPtr)0x0;
  }
  if (node->type != XML_ELEMENT_NODE) {
    return (xmlAttrPtr)0x0;
  }
  pxVar9 = node->properties;
  doc = (xmlDoc *)node;
  if (pxVar9 != (xmlAttrPtr)0x0) {
    if (nsName == (xmlChar *)0x0) {
      do {
        if (pxVar9->ns == (xmlNs *)0x0) {
          doc = (xmlDoc *)pxVar9->name;
          iVar3 = xmlStrEqual((xmlChar *)doc,name);
          if (iVar3 != 0) {
            return pxVar9;
          }
        }
        pxVar9 = pxVar9->next;
      } while (pxVar9 != (_xmlAttr *)0x0);
    }
    else {
      do {
        if (pxVar9->ns != (xmlNs *)0x0) {
          doc = (xmlDoc *)pxVar9->name;
          iVar3 = xmlStrEqual((xmlChar *)doc,name);
          if (iVar3 != 0) {
            doc = (xmlDoc *)pxVar9->ns->href;
            if (doc == (xmlDoc *)nsName) {
              return pxVar9;
            }
            iVar3 = xmlStrEqual((xmlChar *)doc,nsName);
            if (iVar3 != 0) {
              return pxVar9;
            }
          }
        }
        pxVar9 = pxVar9->next;
      } while (pxVar9 != (_xmlAttr *)0x0);
    }
  }
  if (useDTD == 0) {
    return (xmlAttrPtr)0x0;
  }
  p_Var1 = node->doc;
  if (p_Var1 == (_xmlDoc *)0x0) {
    return (xmlAttrPtr)0x0;
  }
  if (p_Var1->intSubset == (_xmlDtd *)0x0) {
    return (xmlAttrPtr)0x0;
  }
  if ((node->ns == (xmlNs *)0x0) || (doc = (xmlDoc *)node->ns->prefix, doc == (xmlDoc *)0x0)) {
    elem = (xmlNsPtr *)node->name;
    local_40 = (xmlNsPtr *)0x0;
LAB_0018cb8d:
    if (nsName == (xmlChar *)0x0) {
      pxVar6 = xmlGetDtdQAttrDesc(p_Var1->intSubset,(xmlChar *)elem,name,(xmlChar *)0x0);
      if (pxVar6 == (xmlAttributePtr)0x0) {
        if (p_Var1->extSubset == (xmlDtdPtr)0x0) {
          pxVar6 = (xmlAttributePtr)0x0;
        }
        else {
          pxVar6 = xmlGetDtdQAttrDesc(p_Var1->extSubset,(xmlChar *)elem,name,(xmlChar *)0x0);
        }
      }
    }
    else {
      ppxVar4 = xmlGetNsList(doc,node);
      if (ppxVar4 == (xmlNsPtr *)0x0) {
        pxVar6 = (xmlAttributePtr)0x0;
        ppxVar7 = local_40;
        if (local_40 != (xmlNsPtr *)0x0) goto LAB_0018cc8f;
      }
      else {
        pxVar5 = *ppxVar4;
        ppxVar8 = ppxVar4;
        ppxVar7 = ppxVar4;
        if (pxVar5 == (xmlNsPtr)0x0) {
          pxVar6 = (xmlAttributePtr)0x0;
        }
        else {
          do {
            iVar3 = xmlStrEqual(pxVar5->href,nsName);
            if ((iVar3 != 0) &&
               ((pxVar6 = xmlGetDtdQAttrDesc(p_Var1->intSubset,(xmlChar *)elem,name,
                                             (*ppxVar8)->prefix), pxVar6 != (xmlAttributePtr)0x0 ||
                ((p_Var1->extSubset != (xmlDtdPtr)0x0 &&
                 (pxVar6 = xmlGetDtdQAttrDesc(p_Var1->extSubset,(xmlChar *)elem,name,
                                              (*ppxVar8)->prefix), pxVar6 != (xmlAttributePtr)0x0)))
                ))) goto LAB_0018cc8f;
            pxVar5 = ppxVar8[1];
            ppxVar8 = ppxVar8 + 1;
          } while (pxVar5 != (xmlNsPtr)0x0);
          pxVar6 = (xmlAttributePtr)0x0;
        }
LAB_0018cc8f:
        (*xmlFree)(ppxVar7);
      }
      if (ppxVar4 == (xmlNsPtr *)0x0) goto LAB_0018ccc2;
    }
    if (local_40 != (xmlNsPtr *)0x0) {
      (*xmlFree)(local_40);
    }
    if ((pxVar6 != (xmlAttributePtr)0x0) && (pxVar6->defaultValue != (xmlChar *)0x0)) {
      bVar2 = false;
      goto LAB_0018ccc7;
    }
    bVar2 = true;
  }
  else {
    cur = xmlStrdup((xmlChar *)doc);
    doc = (xmlDoc *)xmlStrcat(cur,":");
    elem = (xmlNsPtr *)xmlStrcat((xmlChar *)doc,node->name);
    local_40 = elem;
    if (elem != (xmlNsPtr *)0x0) goto LAB_0018cb8d;
LAB_0018ccc2:
    bVar2 = false;
  }
  pxVar6 = (xmlAttributePtr)0x0;
LAB_0018ccc7:
  if (bVar2) {
    return (xmlAttrPtr)0x0;
  }
  return (xmlAttrPtr)pxVar6;
}

Assistant:

static xmlAttrPtr
xmlGetPropNodeInternal(const xmlNode *node, const xmlChar *name,
		       const xmlChar *nsName, int useDTD)
{
    xmlAttrPtr prop;

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE) || (name == NULL))
	return(NULL);

    if (node->properties != NULL) {
	prop = node->properties;
	if (nsName == NULL) {
	    /*
	    * We want the attr to be in no namespace.
	    */
	    do {
		if ((prop->ns == NULL) && xmlStrEqual(prop->name, name)) {
		    return(prop);
		}
		prop = prop->next;
	    } while (prop != NULL);
	} else {
	    /*
	    * We want the attr to be in the specified namespace.
	    */
	    do {
		if ((prop->ns != NULL) && xmlStrEqual(prop->name, name) &&
		    ((prop->ns->href == nsName) ||
		     xmlStrEqual(prop->ns->href, nsName)))
		{
		    return(prop);
		}
		prop = prop->next;
	    } while (prop != NULL);
	}
    }

#ifdef LIBXML_TREE_ENABLED
    if (! useDTD)
	return(NULL);
    /*
     * Check if there is a default/fixed attribute declaration in
     * the internal or external subset.
     */
    if ((node->doc != NULL) && (node->doc->intSubset != NULL)) {
	xmlDocPtr doc = node->doc;
	xmlAttributePtr attrDecl = NULL;
	xmlChar *elemQName, *tmpstr = NULL;

	/*
	* We need the QName of the element for the DTD-lookup.
	*/
	if ((node->ns != NULL) && (node->ns->prefix != NULL)) {
	    tmpstr = xmlStrdup(node->ns->prefix);
	    tmpstr = xmlStrcat(tmpstr, BAD_CAST ":");
	    tmpstr = xmlStrcat(tmpstr, node->name);
	    if (tmpstr == NULL)
		return(NULL);
	    elemQName = tmpstr;
	} else
	    elemQName = (xmlChar *) node->name;
	if (nsName == NULL) {
	    /*
	    * The common and nice case: Attr in no namespace.
	    */
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset,
		elemQName, name, NULL);
	    if ((attrDecl == NULL) && (doc->extSubset != NULL)) {
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset,
		    elemQName, name, NULL);
	    }
	} else {
	    xmlNsPtr *nsList, *cur;

	    /*
	    * The ugly case: Search using the prefixes of in-scope
	    * ns-decls corresponding to @nsName.
	    */
	    nsList = xmlGetNsList(node->doc, node);
	    if (nsList == NULL) {
		if (tmpstr != NULL)
		    xmlFree(tmpstr);
		return(NULL);
	    }
	    cur = nsList;
	    while (*cur != NULL) {
		if (xmlStrEqual((*cur)->href, nsName)) {
		    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, elemQName,
			name, (*cur)->prefix);
		    if (attrDecl)
			break;
		    if (doc->extSubset != NULL) {
			attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, elemQName,
			    name, (*cur)->prefix);
			if (attrDecl)
			    break;
		    }
		}
		cur++;
	    }
	    xmlFree(nsList);
	}
	if (tmpstr != NULL)
	    xmlFree(tmpstr);
	/*
	* Only default/fixed attrs are relevant.
	*/
	if ((attrDecl != NULL) && (attrDecl->defaultValue != NULL))
	    return((xmlAttrPtr) attrDecl);
    }
#endif /* LIBXML_TREE_ENABLED */
    return(NULL);
}